

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

bool __thiscall
caffe::WindowDataParameter::MergePartialFromCodedStream
          (WindowDataParameter *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  UnknownFieldSet *unknown_fields;
  string *psVar5;
  char *field_name;
  ArenaStringPtr *pAVar6;
  uint32 *value;
  bool *value_00;
  float *value_01;
  char cVar7;
  uint tag;
  ulong uVar8;
  
LAB_004aa405:
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_004aa429;
      input->buffer_ = pbVar2 + 1;
      uVar8 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_004aa429:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar8 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar4 | uVar8;
    }
    tag = (uint)uVar8;
    if ((uVar8 & 0x100000000) == 0) goto switchD_004aa498_default;
    cVar7 = (char)uVar8;
    switch((uint)(uVar8 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar7 == '\n') {
        psVar5 = mutable_source_abi_cxx11_(this);
        bVar3 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar5);
        field_name = "caffe.WindowDataParameter.source";
        pAVar6 = &this->source_;
LAB_004aa627:
        if (bVar3 == false) {
          return false;
        }
        google::protobuf::internal::WireFormatLite::VerifyUtf8String
                  ((pAVar6->ptr_->_M_dataplus)._M_p,(int)pAVar6->ptr_->_M_string_length,PARSE,
                   field_name);
        goto LAB_004aa405;
      }
      break;
    case 2:
      if (cVar7 != '\x15') break;
      pbVar2 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar2 = *pbVar2 | 2;
      value_01 = &this->scale_;
LAB_004aa657:
      bVar3 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                        (input,value_01);
      goto LAB_004aa47b;
    case 3:
      if (cVar7 == '\x1a') {
        psVar5 = mutable_mean_file_abi_cxx11_(this);
        bVar3 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar5);
        field_name = "caffe.WindowDataParameter.mean_file";
        pAVar6 = &this->mean_file_;
        goto LAB_004aa627;
      }
      break;
    case 4:
      if (cVar7 == ' ') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
        value = &this->batch_size_;
LAB_004aa582:
        bVar3 = google::protobuf::io::CodedInputStream::ReadVarint32(input,value);
        goto LAB_004aa47b;
      }
      break;
    case 5:
      if (cVar7 == '(') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
        value = &this->crop_size_;
        goto LAB_004aa582;
      }
      break;
    case 6:
      if (cVar7 == '0') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x40;
        value_00 = &this->mirror_;
LAB_004aa5db:
        bVar3 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (input,value_00);
        goto LAB_004aa47b;
      }
      break;
    case 7:
      if (cVar7 == '=') {
        pbVar2 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar2 = *pbVar2 | 4;
        value_01 = &this->fg_threshold_;
        goto LAB_004aa657;
      }
      break;
    case 8:
      if (cVar7 == 'E') {
        pbVar2 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar2 = *pbVar2 | 8;
        value_01 = &this->bg_threshold_;
        goto LAB_004aa657;
      }
      break;
    case 9:
      if (cVar7 == 'M') {
        pbVar2 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar2 = *pbVar2 | 0x10;
        value_01 = &this->fg_fraction_;
        goto LAB_004aa657;
      }
      break;
    case 10:
      if (cVar7 == 'P') {
        pbVar2 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar2 = *pbVar2 | 1;
        value = &this->context_pad_;
        goto LAB_004aa582;
      }
      break;
    case 0xb:
      if (cVar7 == 'Z') {
        psVar5 = mutable_crop_mode_abi_cxx11_(this);
        bVar3 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar5);
        field_name = "caffe.WindowDataParameter.crop_mode";
        pAVar6 = &this->crop_mode_;
        goto LAB_004aa627;
      }
      break;
    case 0xc:
      if (cVar7 == '`') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x80;
        value_00 = &this->cache_images_;
        goto LAB_004aa5db;
      }
      break;
    case 0xd:
      if (cVar7 == 'j') {
        psVar5 = mutable_root_folder_abi_cxx11_(this);
        bVar3 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar5);
        field_name = "caffe.WindowDataParameter.root_folder";
        pAVar6 = &this->root_folder_;
        goto LAB_004aa627;
      }
    }
switchD_004aa498_default:
    if (tag == 0) {
      return true;
    }
    if ((tag & 7) == 4) {
      return true;
    }
    unknown_fields = mutable_unknown_fields(this);
    bVar3 = google::protobuf::internal::WireFormat::SkipField(input,tag,unknown_fields);
LAB_004aa47b:
    if (bVar3 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool WindowDataParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.WindowDataParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string source = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_source()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->source().data(), this->source().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.WindowDataParameter.source");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float scale = 2 [default = 1];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(21u)) {
          set_has_scale();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &scale_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string mean_file = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_mean_file()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->mean_file().data(), this->mean_file().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.WindowDataParameter.mean_file");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 batch_size = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          set_has_batch_size();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &batch_size_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 crop_size = 5 [default = 0];
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {
          set_has_crop_size();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &crop_size_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool mirror = 6 [default = false];
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(48u)) {
          set_has_mirror();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &mirror_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float fg_threshold = 7 [default = 0.5];
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(61u)) {
          set_has_fg_threshold();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &fg_threshold_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float bg_threshold = 8 [default = 0.5];
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(69u)) {
          set_has_bg_threshold();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &bg_threshold_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float fg_fraction = 9 [default = 0.25];
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(77u)) {
          set_has_fg_fraction();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &fg_fraction_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 context_pad = 10 [default = 0];
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {
          set_has_context_pad();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &context_pad_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string crop_mode = 11 [default = "warp"];
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(90u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_crop_mode()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->crop_mode().data(), this->crop_mode().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.WindowDataParameter.crop_mode");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool cache_images = 12 [default = false];
      case 12: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(96u)) {
          set_has_cache_images();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &cache_images_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string root_folder = 13 [default = ""];
      case 13: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(106u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_root_folder()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->root_folder().data(), this->root_folder().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.WindowDataParameter.root_folder");
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.WindowDataParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.WindowDataParameter)
  return false;
#undef DO_
}